

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_keepalive_handling(void)

{
  _Bool _Var1;
  cio_error cVar2;
  cio_inet_address *arg1;
  uint j;
  long lVar3;
  uint i;
  long lVar4;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
  *bs_read_until_fakes [10];
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    _Var1 = test_keepalive_handling::keepalive_tests[lVar4].immediate_close;
    split_request(test_keepalive_handling::keepalive_tests[lVar4].request);
    if (num_of_request_lines != 0) {
      for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
        bs_read_until_fakes[lVar3] = bs_read_until_ok;
      }
      cio_buffered_stream_read_until_fake.custom_fake =
           (_func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
            *)0x0;
      bs_read_until_fakes[num_of_request_lines - 1] = bs_read_until_blocks;
      cio_buffered_stream_read_until_fake.custom_fake_seq_len = 10;
      header_complete_fake.custom_fake = callback_write_ok_response;
      cio_buffered_stream_read_until_fake.custom_fake_seq = bs_read_until_fakes;
      memcpy(&config,&DAT_001199e0,0xb8);
      arg1 = cio_get_inet_address_any4();
      cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
      cVar2 = cio_http_server_init(&server,&loop,&config);
      UnityAssertEqualNumber
                (0,(long)cVar2,"Server initialization failed!",0x4c4,UNITY_DISPLAY_STYLE_INT);
      cVar2 = cio_http_location_init(&target,"/foo",(void *)0x0,alloc_dummy_handler);
      UnityAssertEqualNumber
                (0,(long)cVar2,"Request target initialization failed!",0x4c8,UNITY_DISPLAY_STYLE_INT
                );
      cVar2 = cio_http_server_register_location(&server,&target);
      UnityAssertEqualNumber
                (0,(long)cVar2,"Register request target failed!",0x4ca,UNITY_DISPLAY_STYLE_INT);
      cVar2 = cio_http_server_serve(&server);
      UnityAssertEqualNumber(0,(long)cVar2,"Serving http failed!",0x4cd,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (0,(ulong)serve_error_fake.call_count,"Serve error callback was called!",0x4cf,
                 UNITY_DISPLAY_STYLE_INT);
      check_http_response(200);
      if ((_Var1 & 1U) == 0) {
        UnityAssertEqualNumber
                  (0,(ulong)cio_buffered_stream_close_fake.call_count,
                   "buffered stream was closed before keepalive timeout triggered!",0x4d3,
                   UNITY_DISPLAY_STYLE_INT);
        (*(code *)client_socket[1].impl.loop)
                  (&client_socket[1].impl.close_timer.impl.loop,
                   *(undefined8 *)&client_socket[1].impl.peer_closed_connection,0);
      }
      UnityAssertEqualNumber
                (1,(ulong)cio_buffered_stream_close_fake.call_count,
                 "client socket was not closed after keepalive timeout triggered!",0x4d7,
                 UNITY_DISPLAY_STYLE_INT);
      setUp();
    }
  }
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_keepalive_handling(void)
{
	struct keepalive_test {
		const char *location;
		const char *request;
		int expected_response;
		bool immediate_close;
	};

	static const struct keepalive_test keepalive_tests[] = {
	    {.location = "/foo", .request = "GET /foo HTTP/1.1" CRLF "Content-Length: 0" CRLF CRLF CRLF, .expected_response = 200, .immediate_close = false},
	    {.location = "/foo", .request = "GET /foo HTTP/1.1" CRLF "Content-Length: 0" CRLF "Connection: keep-alive" CRLF CRLF CRLF, .expected_response = 200, .immediate_close = false},
	    {.location = "/foo", .request = "GET /foo HTTP/1.1" CRLF "Content-Length: 0" CRLF "Connection: close" CRLF CRLF CRLF, .expected_response = 200, .immediate_close = true},
	    {.location = "/foo", .request = "GET /foo HTTP/1.0" CRLF "Content-Length: 0" CRLF CRLF CRLF, .expected_response = 200, .immediate_close = true},
	    {.location = "/foo", .request = "GET /foo HTTP/1.0" CRLF "Content-Length: 0" CRLF "Connection: keep-alive" CRLF CRLF CRLF, .expected_response = 200, .immediate_close = false},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(keepalive_tests); i++) {
		struct keepalive_test keepalive_test = keepalive_tests[i];
		split_request(keepalive_test.request);

		if (num_of_request_lines > 0) {
			enum cio_error (*bs_read_until_fakes[10])(struct cio_buffered_stream *, struct cio_read_buffer *, const char *, cio_buffered_stream_read_handler_t, void *);
			size_t array_size = ARRAY_SIZE(bs_read_until_fakes);
			for (unsigned int j = 0; j < array_size - 1; j++) {
				bs_read_until_fakes[j] = bs_read_until_ok;
			}
			bs_read_until_fakes[num_of_request_lines - 1] = bs_read_until_blocks;
			cio_buffered_stream_read_until_fake.custom_fake = NULL;
			SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_until, bs_read_until_fakes, (int)array_size)

			header_complete_fake.custom_fake = callback_write_ok_response;

			struct cio_http_server_configuration config = {
			    .on_error = serve_error,
			    .read_header_timeout_ns = header_read_timeout,
			    .read_body_timeout_ns = body_read_timeout,
			    .response_timeout_ns = response_timeout,
			    .close_timeout_ns = 10,
			    .alloc_client = alloc_dummy_client,
			    .free_client = free_dummy_client};

			cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

			struct cio_http_server server;
			enum cio_error err = cio_http_server_init(&server, &loop, &config);
			TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

			struct cio_http_location target;
			err = cio_http_location_init(&target, keepalive_test.location, NULL, alloc_dummy_handler);
			TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
			err = cio_http_server_register_location(&server, &target);
			TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

			err = cio_http_server_serve(&server);
			TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

			TEST_ASSERT_EQUAL_MESSAGE(0, serve_error_fake.call_count, "Serve error callback was called!");
			check_http_response(keepalive_test.expected_response);

			if (!keepalive_test.immediate_close) {
				TEST_ASSERT_EQUAL_MESSAGE(0, cio_buffered_stream_close_fake.call_count, "buffered stream was closed before keepalive timeout triggered!");
				fire_keepalive_timeout(client_socket);
			}

			TEST_ASSERT_EQUAL_MESSAGE(1, cio_buffered_stream_close_fake.call_count, "client socket was not closed after keepalive timeout triggered!");
			setUp();
		}
	}

	free_dummy_client(client_socket);
}